

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall
CNode::CNode(CNode *this,NodeId idIn,shared_ptr<Sock> sock,CAddress *addrIn,
            uint64_t nKeyedNetGroupIn,uint64_t nLocalHostNonceIn,CAddress *addrBindIn,
            string *addrNameIn,ConnectionType conn_type_in,bool inbound_onion,
            CNodeOptions *node_opts)

{
  string *__return_storage_ptr__;
  _Rb_tree_header *p_Var1;
  NetPermissionFlags *pNVar2;
  _Head_base<0UL,_Transport_*,_false> _Var3;
  bool bVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar5;
  mapped_type_conflict5 *pmVar6;
  long lVar7;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined7 in_stack_00000029;
  NodeId *args;
  list<CNetMessage,_std::allocator<CNetMessage>_> *args_1;
  _Head_base<0UL,_Transport_*,_false> local_48;
  NodeId local_40;
  long local_38;
  
  pNVar2 = (NetPermissionFlags *)CONCAT71(in_stack_00000029,inbound_onion);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = idIn;
  if ((char)pNVar2[8] == 1) {
    std::make_unique<V2Transport,long&,bool>((long *)&local_48,(bool *)&local_40);
    _Var3._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (Transport *)0x0;
    (this->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
    super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
    super__Head_base<0UL,_Transport_*,_false>._M_head_impl = _Var3._M_head_impl;
    std::unique_ptr<V2Transport,_std::default_delete<V2Transport>_>::~unique_ptr
              ((unique_ptr<V2Transport,_std::default_delete<V2Transport>_> *)&local_48);
  }
  else {
    std::make_unique<V1Transport,long&>((long *)&local_48);
    _Var3._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (Transport *)0x0;
    (this->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
    super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
    super__Head_base<0UL,_Transport_*,_false>._M_head_impl = _Var3._M_head_impl;
    std::unique_ptr<V1Transport,_std::default_delete<V1Transport>_>::~unique_ptr
              ((unique_ptr<V1Transport,_std::default_delete<V1Transport>_> *)&local_48);
  }
  this->m_permission_flags = *pNVar2;
  std::__shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2> *)
             sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->m_send_memusage = 0;
  this->nSendBytes = 0;
  std::_Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::_Deque_base
            (&(this->vSendMsg).
              super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>);
  memset(&this->cs_vSend,0,0x90);
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  (this->m_connected).__r = (rep)tVar5.__d.__r;
  CAddress::CAddress(&this->addr,
                     (CAddress *)
                     sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                     _M_pi);
  CAddress::CAddress(&this->addrBind,(CAddress *)nLocalHostNonceIn);
  __return_storage_ptr__ = &this->m_addr_name;
  if (*(long *)((long)&(addrBindIn->super_CService).super_CNetAddr.m_addr._union + 8) == 0) {
    CService::ToStringAddrPort_abi_cxx11_(__return_storage_ptr__,&(this->addr).super_CService);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)addrBindIn);
  }
  std::__cxx11::string::string
            ((string *)&this->m_dest,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)addrBindIn);
  this->m_inbound_onion = (bool)(undefined1)conn_type_in;
  *(undefined8 *)&this->nVersion = 0;
  *(undefined8 *)((long)&(this->m_subver_mutex).super_mutex.super___mutex_base._M_mutex + 4) = 0;
  *(undefined8 *)((long)&(this->m_subver_mutex).super_mutex.super___mutex_base._M_mutex + 0xc) = 0;
  *(undefined8 *)((long)&(this->m_subver_mutex).super_mutex.super___mutex_base._M_mutex + 0x14) = 0;
  (this->m_subver_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_subver_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->cleanSubVer)._M_dataplus._M_p = (pointer)&(this->cleanSubVer).field_2;
  (this->cleanSubVer)._M_string_length = 0;
  (this->cleanSubVer).field_2._M_local_buf[0] = '\0';
  this->m_prefer_evict = SUB41(pNVar2[4],0);
  (this->fSuccessfullyConnected)._M_base._M_i = false;
  (this->fDisconnect)._M_base._M_i = false;
  (this->grantOutbound).sem = (CSemaphore *)0x0;
  (this->grantOutbound).fHaveGrant = false;
  (this->nRefCount).super___atomic_base<int>._M_i = 0;
  this->nKeyedNetGroup = (uint64_t)addrIn;
  (this->fPauseRecv)._M_base._M_i = false;
  (this->fPauseSend)._M_base._M_i = false;
  this->m_conn_type = (ConnectionType)addrNameIn;
  this->m_bip152_highbandwidth_to = (__atomic_base<bool>)0x0;
  this->m_bip152_highbandwidth_from = (__atomic_base<bool>)0x0;
  this->m_has_all_wanted_services = (__atomic_base<bool>)0x0;
  this->m_relays_txs = (__atomic_base<bool>)0x0;
  (this->m_bloom_filter_loaded)._M_base._M_i = false;
  (this->m_last_ping_time)._M_i.__r = 0;
  (this->m_last_block_time)._M_i.__r = 0;
  (this->m_last_tx_time)._M_i.__r = 0;
  (this->m_min_ping_time)._M_i.__r = 0x7fffffffffffffff;
  this->id = idIn;
  this->nLocalHostNonce = nKeyedNetGroupIn;
  (this->m_greatest_common_version).super___atomic_base<int>._M_i = 0xd1;
  this->m_recv_flood_size = *(undefined8 *)(pNVar2 + 6);
  args_1 = &this->vRecvMsg;
  (this->vRecvMsg).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)args_1;
  (this->vRecvMsg).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)args_1;
  (this->vRecvMsg).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl._M_node.
  _M_size = 0;
  (this->m_msg_process_queue_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->m_msg_process_queue_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->m_msg_process_queue_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_msg_process_queue_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_msg_process_queue_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_msg_process_queue).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_msg_process_queue;
  (this->m_msg_process_queue).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_msg_process_queue;
  (this->m_msg_process_queue).super__List_base<CNetMessage,_std::allocator<CNetMessage>_>._M_impl.
  _M_node._M_size = 0;
  this->m_msg_process_queue_size = 0;
  CService::CService(&this->m_addr_local);
  *(undefined8 *)((long)&(this->m_addr_local_mutex).super_mutex.super___mutex_base._M_mutex + 0x10)
       = 0;
  (this->m_addr_local_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_addr_local_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_addr_local_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0
  ;
  (this->m_addr_local_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header;
  (this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mapSendBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header;
  (this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mapRecvBytesPerMsgType)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_i2p_sam_session)._M_t.
  super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
  super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl = *(Session **)(pNVar2 + 2);
  pNVar2[2] = None;
  pNVar2[3] = None;
  if (((ConnectionType)addrNameIn != INBOUND & (undefined1)conn_type_in) != INBOUND) {
    __assert_fail("conn_type_in == ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ,0xec7,
                  "CNode::CNode(NodeId, std::shared_ptr<Sock>, const CAddress &, uint64_t, uint64_t, const CAddress &, const std::string &, ConnectionType, bool, CNodeOptions &&)"
                 );
  }
  args = &this->id;
  for (lVar7 = 0; lVar7 != 0x460; lVar7 = lVar7 + 0x20) {
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->mapRecvBytesPerMsgType,
                          (key_type *)
                          ((long)&ALL_NET_MESSAGE_TYPES_abi_cxx11_._M_elems[0]._M_dataplus._M_p +
                          lVar7));
    *pmVar6 = 0;
  }
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](&this->mapRecvBytesPerMsgType,&NET_MESSAGE_TYPE_OTHER_abi_cxx11_);
  *pmVar6 = 0;
  if (fLogIPs == true) {
    bVar4 = ::LogAcceptCategory(NET,Debug);
    if (bVar4) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      logging_function._M_str = "CNode";
      logging_function._M_len = 5;
      LogPrintf_<std::__cxx11::string,long>
                (logging_function,source_file,0xecf,
                 IPC|I2P|QT|LIBEVENT|PROXY|PRUNE|RAND|REINDEX|SELECTCOINS|ADDRMAN|RPC|WALLETDB|TOR,
                 (Level)__return_storage_ptr__,(char *)args,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                 (long *)args_1);
    }
  }
  else {
    bVar4 = ::LogAcceptCategory(NET,Debug);
    if (bVar4) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_00._M_len = 0x50;
      logging_function_00._M_str = "CNode";
      logging_function_00._M_len = 5;
      LogPrintf_<long>(logging_function_00,source_file_00,0xed1,NET,Debug,
                       "Added connection peer=%d\n",args);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CNode::CNode(NodeId idIn,
             std::shared_ptr<Sock> sock,
             const CAddress& addrIn,
             uint64_t nKeyedNetGroupIn,
             uint64_t nLocalHostNonceIn,
             const CAddress& addrBindIn,
             const std::string& addrNameIn,
             ConnectionType conn_type_in,
             bool inbound_onion,
             CNodeOptions&& node_opts)
    : m_transport{MakeTransport(idIn, node_opts.use_v2transport, conn_type_in == ConnectionType::INBOUND)},
      m_permission_flags{node_opts.permission_flags},
      m_sock{sock},
      m_connected{GetTime<std::chrono::seconds>()},
      addr{addrIn},
      addrBind{addrBindIn},
      m_addr_name{addrNameIn.empty() ? addr.ToStringAddrPort() : addrNameIn},
      m_dest(addrNameIn),
      m_inbound_onion{inbound_onion},
      m_prefer_evict{node_opts.prefer_evict},
      nKeyedNetGroup{nKeyedNetGroupIn},
      m_conn_type{conn_type_in},
      id{idIn},
      nLocalHostNonce{nLocalHostNonceIn},
      m_recv_flood_size{node_opts.recv_flood_size},
      m_i2p_sam_session{std::move(node_opts.i2p_sam_session)}
{
    if (inbound_onion) assert(conn_type_in == ConnectionType::INBOUND);

    for (const auto& msg : ALL_NET_MESSAGE_TYPES) {
        mapRecvBytesPerMsgType[msg] = 0;
    }
    mapRecvBytesPerMsgType[NET_MESSAGE_TYPE_OTHER] = 0;

    if (fLogIPs) {
        LogDebug(BCLog::NET, "Added connection to %s peer=%d\n", m_addr_name, id);
    } else {
        LogDebug(BCLog::NET, "Added connection peer=%d\n", id);
    }
}